

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O2

void __thiscall FlasherInfo::print(FlasherInfo *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  ulong __n;
  reference rVar5;
  
  printf("Device       : %s\n",(this->name)._M_dataplus._M_p);
  printf("Version      : %s\n",(this->version)._M_dataplus._M_p);
  printf("Address      : 0x%x\n",(ulong)this->address);
  printf("Pages        : %d\n",(ulong)this->numPages);
  printf("Page Size    : %d bytes\n",(ulong)this->pageSize);
  printf("Total Size   : %dKB\n",(ulong)(this->totalSize >> 10));
  printf("Planes       : %d\n",(ulong)this->numPlanes);
  printf("Lock Regions : %zd\n",
         (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
         ((long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         (long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  printf("Locked       : ");
  bVar1 = true;
  pcVar3 = "";
  for (uVar4 = 0; __n = (ulong)uVar4,
      __n < (ulong)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(this->lockRegions).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      uVar4 = uVar4 + 1) {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->lockRegions,__n);
    if ((*rVar5._M_p & rVar5._M_mask) != 0) {
      pcVar2 = ",";
      if (bVar1) {
        pcVar2 = "";
      }
      bVar1 = false;
      printf("%s%d",pcVar2,__n);
    }
  }
  if (bVar1) {
    pcVar3 = "none";
  }
  puts(pcVar3);
  pcVar2 = "false";
  pcVar3 = "false";
  if (this->security != false) {
    pcVar3 = "true";
  }
  printf("Security     : %s\n",pcVar3);
  if (this->canBootFlash != false) {
    pcVar3 = "false";
    if (this->bootFlash != false) {
      pcVar3 = "true";
    }
    printf("Boot Flash   : %s\n",pcVar3);
  }
  if (this->canBod == true) {
    pcVar3 = "false";
    if (this->bod != false) {
      pcVar3 = "true";
    }
    printf("BOD          : %s\n",pcVar3);
  }
  if (this->canBor == true) {
    if (this->bor != false) {
      pcVar2 = "true";
    }
    printf("BOR          : %s\n",pcVar2);
    return;
  }
  return;
}

Assistant:

void
FlasherInfo::print()
{
    bool first;

    printf("Device       : %s\n", name.c_str());
    printf("Version      : %s\n", version.c_str());
    printf("Address      : 0x%x\n", address);
    printf("Pages        : %d\n", numPages);
    printf("Page Size    : %d bytes\n", pageSize);
    printf("Total Size   : %dKB\n", totalSize / 1024);
    printf("Planes       : %d\n", numPlanes);
    printf("Lock Regions : %zd\n", lockRegions.size());
    printf("Locked       : ");
    first = true;
    for (uint32_t region = 0; region < lockRegions.size(); region++)
    {
        if (lockRegions[region])
        {
            printf("%s%d", first ? "" : ",", region);
            first = false;
        }
    }
    printf("%s\n", first ? "none" : "");
    printf("Security     : %s\n", security ? "true" : "false");
    if (canBootFlash)
        printf("Boot Flash   : %s\n", bootFlash ? "true" : "false");
    if (canBod)
        printf("BOD          : %s\n", bod ? "true" : "false");
    if (canBor)
        printf("BOR          : %s\n", bor ? "true" : "false");
}